

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

index_t __thiscall
GEO::Delaunay3dThread::stellate_conflict_zone_iterative
          (Delaunay3dThread *this,index_t v_in,index_t t1,index_t t1fbord,index_t t1fprev)

{
  bool bVar1;
  signed_index_t sVar2;
  signed_index_t v2;
  signed_index_t v3;
  signed_index_t v4;
  index_t iVar3;
  index_t lf1;
  index_t result;
  index_t tbord;
  index_t t2ft1;
  index_t t2fbord;
  index_t t2;
  index_t t1ft2;
  index_t new_t;
  signed_index_t v;
  index_t t1fprev_local;
  index_t t1fbord_local;
  index_t t1_local;
  index_t v_in_local;
  Delaunay3dThread *this_local;
  
  t1ft2 = v_in;
  new_t = t1fprev;
  v = t1fbord;
  t1fprev_local = t1;
  t1fbord_local = v_in;
  _t1_local = this;
  StellateConflictStack::push(&this->S2_,t1,t1fbord,t1fprev);
  do {
    StellateConflictStack::get_parameters(&this->S2_,&t1fprev_local,(index_t *)&v,&new_t);
    sVar2 = tet_vertex(this,t1fprev_local,0);
    v2 = tet_vertex(this,t1fprev_local,1);
    v3 = tet_vertex(this,t1fprev_local,2);
    v4 = tet_vertex(this,t1fprev_local,3);
    t2 = new_tetrahedron(this,sVar2,v2,v3,v4);
    set_tet_vertex(this,t2,v,t1ft2);
    iVar3 = tet_adjacent(this,t1fprev_local,v);
    set_tet_adjacent(this,t2,v,iVar3);
    lf1 = find_tet_adjacent(this,iVar3,t1fprev_local);
    set_tet_adjacent(this,iVar3,lf1,t2);
    t2fbord = 0;
LAB_00250fd7:
    iVar3 = t2;
    if (3 < t2fbord) {
      StellateConflictStack::pop(&this->S2_);
      bVar1 = StellateConflictStack::empty(&this->S2_);
      if (bVar1) {
        return iVar3;
      }
      StellateConflictStack::get_parameters(&this->S2_,&t1fprev_local,(index_t *)&v,&new_t);
      StellateConflictStack::get_locals(&this->S2_,&t2,&t2fbord,&result);
      t2ft1 = iVar3;
LAB_002510c4:
      set_tet_adjacent(this,t2ft1,result,t2);
      set_tet_adjacent(this,t2,t2fbord,t2ft1);
LAB_002510e8:
      t2fbord = t2fbord + 1;
      goto LAB_00250fd7;
    }
    if ((t2fbord == new_t) || (sVar2 = tet_adjacent(this,t2,t2fbord), sVar2 != -1))
    goto LAB_002510e8;
    bVar1 = get_neighbor_along_conflict_zone_border
                      (this,t1fprev_local,v,t2fbord,&t2ft1,&tbord,&result);
    if (bVar1) goto LAB_002510c4;
    StellateConflictStack::save_locals(&this->S2_,t2,t2fbord,result);
    StellateConflictStack::push(&this->S2_,t2ft1,tbord,result);
  } while( true );
}

Assistant:

index_t stellate_conflict_zone_iterative(
            index_t v_in, index_t t1, index_t t1fbord,
            index_t t1fprev = index_t(-1)
        ) {
            //   This function is de-recursified because some degenerate
            // inputs can cause stack overflow (system stack is limited to
            // a few megs). For instance, it can happen when a large number
            // of points are on the same sphere exactly.
            
            //   To de-recursify, it uses class StellateConflictStack
            // that emulates system's stack for storing functions's
            // parameters and local variables in all the nested stack
            // frames. 
        
            signed_index_t v = signed_index_t(v_in);
            
            S2_.push(t1, t1fbord, t1fprev);
            
            index_t new_t;   // the newly created tetrahedron.
            
            index_t t1ft2;   // traverses the 4 facets of t1.
            
            index_t t2;      // the tetrahedron on the border of
                             // the conflict zone that shares an
                             // edge with t1 along t1ft2.
            
            index_t t2fbord; // the facet of t2 on the border of
                             // the conflict zone.
        
            index_t t2ft1;   // the facet of t2 that is incident to t1.
        
        entry_point:
            S2_.get_parameters(t1, t1fbord, t1fprev);


            geo_debug_assert(owns_tet(t1));
            geo_debug_assert(tet_adjacent(t1,t1fbord)>=0);
            geo_debug_assert(owns_tet(index_t(tet_adjacent(t1,t1fbord))));
            geo_debug_assert(tet_is_marked_as_conflict(t1));
            geo_debug_assert(
                !tet_is_marked_as_conflict(index_t(tet_adjacent(t1,t1fbord)))
            );

            // Create new tetrahedron with same vertices as t_bndry
            new_t = new_tetrahedron(
                tet_vertex(t1,0),
                tet_vertex(t1,1),
                tet_vertex(t1,2),
                tet_vertex(t1,3)
            );

            // Replace in new_t the vertex opposite to t1fbord with v
            set_tet_vertex(new_t, t1fbord, v);
            
            // Connect new_t with t1's neighbor accros t1fbord
            {
                index_t tbord = index_t(tet_adjacent(t1,t1fbord));
                set_tet_adjacent(new_t, t1fbord, tbord);
                set_tet_adjacent(tbord, find_tet_adjacent(tbord,t1), new_t);
            }
            
            //  Lookup new_t's neighbors accros its three other
            // facets and connect them
            for(t1ft2=0; t1ft2<4; ++t1ft2) {
                
                if(t1ft2 == t1fprev || tet_adjacent(new_t,t1ft2) != -1) {
                    continue;
                }
                
                // Get t1's neighbor along the border of the conflict zone
                if(!get_neighbor_along_conflict_zone_border(
                       t1,t1fbord,t1ft2, t2,t2fbord,t2ft1
                )) {
                    //   If t1's neighbor is not a new tetrahedron,
                    // create a new tetrahedron through a recursive call.
                    S2_.save_locals(new_t, t1ft2, t2ft1);
                    S2_.push(t2, t2fbord, t2ft1);
                    goto entry_point;

                return_point:
                    // This is the return value of the called function.
                    index_t result = new_t;
                    S2_.pop();
                    
                    // Special case: we were in the outermost frame, 
                    // then we (truly) return from the function.
                    if(S2_.empty()) {
                        return result;
                    }
                    
                    S2_.get_parameters(t1, t1fbord, t1fprev);
                    S2_.get_locals(new_t, t1ft2, t2ft1); 
                    t2 = result; 
                }
                
                set_tet_adjacent(t2, t2ft1, new_t);
                set_tet_adjacent(new_t, t1ft2, t2);
            }

            // Except for the initial call (see "Special case" above),
            // the nested calls all come from the same location,
            // thus there is only one possible return point
            // (no need to push any return address).
            goto return_point;
        }